

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::ExceptionOr<kj::HttpInputStream::Request>::~ExceptionOr
          (ExceptionOr<kj::HttpInputStream::Request> *this)

{
  ExceptionOr<kj::HttpInputStream::Request> *this_local;
  
  Maybe<kj::HttpInputStream::Request>::~Maybe(&this->value);
  ExceptionOrValue::~ExceptionOrValue(&this->super_ExceptionOrValue);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}